

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

bool __thiscall
webfront::http::std::experimental::net::v1::detail::posix_event::
maybe_unlock_and_signal_one<std::experimental::net::v1::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  pthread_cond_t *in_RDI;
  
  in_RDI[1].__align = in_RDI[1].__align | 1;
  uVar1 = in_RDI[1].__align;
  if (1 < uVar1) {
    conditionally_enabled_mutex::scoped_lock::unlock((scoped_lock *)&in_RDI->__data);
    pthread_cond_signal(in_RDI);
  }
  return 1 < uVar1;
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    NET_TS_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }